

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O0

ostream * despot::operator<<(ostream *os,LaserTag *lasertag)

{
  int iVar1;
  ostream *poVar2;
  const_reference pvVar3;
  void *this;
  const_reference ppTVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  size_type sVar7;
  const_reference pvVar8;
  int local_24;
  int local_20;
  int i;
  int d;
  int s;
  LaserTag *lasertag_local;
  ostream *os_local;
  
  i = 0;
  while( true ) {
    iVar1 = (**(code **)(*(long *)&lasertag->super_BaseTag + 0x10))();
    if (iVar1 <= i) break;
    poVar2 = std::operator<<(os,"State ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,i);
    poVar2 = std::operator<<(poVar2," ");
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(lasertag->super_BaseTag).opp_,(long)i);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar3);
    poVar2 = std::operator<<(poVar2," ");
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(lasertag->super_BaseTag).rob_,(long)i);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar3);
    poVar2 = std::operator<<(poVar2," ");
    iVar1 = despot::Floor::NumCells();
    this = (void *)std::ostream::operator<<(poVar2,iVar1);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    ppTVar4 = std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::operator[]
                        (&(lasertag->super_BaseTag).states_,(long)i);
    (**(code **)(*(long *)&lasertag->super_BaseTag + 0xc0))(lasertag,*ppTVar4,os);
    for (local_20 = 0; local_20 < LaserTag::NBEAMS; local_20 = local_20 + 1) {
      std::ostream::operator<<(os,local_20);
      local_24 = 0;
      while( true ) {
        pvVar5 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[](&lasertag->reading_distributions_,(long)i);
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar5,(long)local_20);
        sVar7 = std::vector<double,_std::allocator<double>_>::size(pvVar6);
        if (sVar7 <= (ulong)(long)local_24) break;
        poVar2 = std::operator<<(os," ");
        pvVar5 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[](&lasertag->reading_distributions_,(long)i);
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar5,(long)local_20);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(long)local_24);
        std::ostream::operator<<(poVar2,*pvVar8);
        local_24 = local_24 + 1;
      }
      std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
    }
    i = i + 1;
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const LaserTag& lasertag) {
	for (int s = 0; s < lasertag.NumStates(); s++) {
		os << "State " << s << " " << lasertag.opp_[s] << " "
			<< lasertag.rob_[s] << " " << lasertag.floor_.NumCells() << endl;
		lasertag.PrintState(*lasertag.states_[s], os);

		for (int d = 0; d < lasertag.NBEAMS; d++) {
			os << d;
			for (int i = 0; i < lasertag.reading_distributions_[s][d].size(); i++)
				os << " " << lasertag.reading_distributions_[s][d][i];
			os << endl;
		}
	}
	return os;
}